

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5StorageCount(Fts5Storage *p,char *zSuffix,i64 *pnRow)

{
  long lVar1;
  int iVar2;
  sqlite3_stmt *pStmt;
  sqlite3_int64 sVar3;
  sqlite3_int64 *in_RDX;
  sqlite3 *in_RSI;
  sqlite3_stmt *in_RDI;
  long in_FS_OFFSET;
  int rc;
  char *zSql;
  Fts5Config *pConfig;
  sqlite3_stmt *pCnt;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = *(long *)in_RDI;
  uVar4 = 0xaaaaaaaa;
  pStmt = (sqlite3_stmt *)
          sqlite3_mprintf("SELECT count(*) FROM %Q.\'%q_%s\'",*(undefined8 *)(lVar6 + 0x10),
                          *(undefined8 *)(lVar6 + 0x18),in_RSI);
  if (pStmt == (sqlite3_stmt *)0x0) {
    iVar5 = 7;
  }
  else {
    iVar5 = sqlite3_prepare_v2(in_RSI,(char *)in_RDX,(int)((ulong)lVar6 >> 0x20),
                               (sqlite3_stmt **)pStmt,
                               (char **)CONCAT44(uVar4,in_stack_ffffffffffffffc0));
    if (iVar5 == 0) {
      iVar2 = sqlite3_step(in_RDI);
      if (iVar2 == 100) {
        sVar3 = sqlite3_column_int64
                          ((sqlite3_stmt *)CONCAT44(iVar5,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
        *in_RDX = sVar3;
      }
      iVar5 = sqlite3_finalize(pStmt);
    }
  }
  sqlite3_free((void *)0x28a33c);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int fts5StorageCount(Fts5Storage *p, const char *zSuffix, i64 *pnRow){
  Fts5Config *pConfig = p->pConfig;
  char *zSql;
  int rc;

  zSql = sqlite3_mprintf("SELECT count(*) FROM %Q.'%q_%s'",
      pConfig->zDb, pConfig->zName, zSuffix
  );
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
  }else{
    sqlite3_stmt *pCnt = 0;
    rc = sqlite3_prepare_v2(pConfig->db, zSql, -1, &pCnt, 0);
    if( rc==SQLITE_OK ){
      if( SQLITE_ROW==sqlite3_step(pCnt) ){
        *pnRow = sqlite3_column_int64(pCnt, 0);
      }
      rc = sqlite3_finalize(pCnt);
    }
  }

  sqlite3_free(zSql);
  return rc;
}